

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.cc
# Opt level: O3

void __thiscall muduo::FileUtil::AppendFile::append(AppendFile *this,char *logline,size_t len)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = fwrite_unlocked(logline,1,len,(FILE *)this->fp_);
  do {
    if (sVar2 == len) {
LAB_00116c11:
      this->writtenBytes_ = this->writtenBytes_ + len;
      return;
    }
    sVar3 = fwrite_unlocked(logline + sVar2,1,len - sVar2,(FILE *)this->fp_);
    if (sVar3 == 0) {
      uVar1 = ferror((FILE *)this->fp_);
      if (uVar1 != 0) {
        append((AppendFile *)(ulong)uVar1);
      }
      goto LAB_00116c11;
    }
    sVar2 = sVar2 + sVar3;
  } while( true );
}

Assistant:

void FileUtil::AppendFile::append(const char* logline, const size_t len)
{
  size_t n = write(logline, len);
  size_t remain = len - n;
  while (remain > 0)
  {
    size_t x = write(logline + n, remain);
    if (x == 0)
    {
      int err = ferror(fp_);
      if (err)
      {
        fprintf(stderr, "AppendFile::append() failed %s\n", strerror_tl(err));
      }
      break;
    }
    n += x;
    remain = len - n; // remain -= x
  }

  writtenBytes_ += len;
}